

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string_values.cpp
# Opt level: O1

void __thiscall ON_ScaleValue::SwapLeftAndRight(ON_ScaleValue *this)

{
  ON_wString *src;
  ON_wString *src_00;
  ON_wString *src_01;
  double dVar1;
  StringFormat SVar2;
  undefined3 uVar3;
  uint uVar4;
  ON_LengthValue t;
  ON_LengthValue local_e0;
  ON_ScaleValue local_b0;
  
  dVar1 = this->m_left_to_right_scale;
  this->m_left_to_right_scale = this->m_right_to_left_scale;
  this->m_right_to_left_scale = dVar1;
  ON_LengthValue::ON_LengthValue(&local_e0,&this->m_left_length);
  SVar2 = (this->m_right_length).m_string_format;
  (this->m_left_length).m_context_angle_unit_system =
       (this->m_right_length).m_context_angle_unit_system;
  (this->m_left_length).m_string_format = SVar2;
  (this->m_left_length).m_context_locale_id = (this->m_right_length).m_context_locale_id;
  uVar3 = *(undefined3 *)&(this->m_right_length).m_length_unit_system.field_0x1;
  uVar4 = (this->m_right_length).m_length_unit_system.m_reserved;
  dVar1 = (this->m_right_length).m_length_unit_system.m_meters_per_custom_unit;
  (this->m_left_length).m_length_unit_system.m_unit_system =
       (this->m_right_length).m_length_unit_system.m_unit_system;
  *(undefined3 *)&(this->m_left_length).m_length_unit_system.field_0x1 = uVar3;
  (this->m_left_length).m_length_unit_system.m_reserved = uVar4;
  (this->m_left_length).m_length_unit_system.m_meters_per_custom_unit = dVar1;
  src = &(this->m_right_length).m_length_unit_system.m_custom_unit_name;
  ON_wString::operator=(&(this->m_left_length).m_length_unit_system.m_custom_unit_name,src);
  (this->m_left_length).m_length = (this->m_right_length).m_length;
  src_00 = &(this->m_right_length).m_length_as_string;
  ON_wString::operator=(&(this->m_left_length).m_length_as_string,src_00);
  src_01 = &local_e0.m_length_unit_system.m_custom_unit_name;
  (this->m_right_length).m_context_angle_unit_system = local_e0.m_context_angle_unit_system;
  (this->m_right_length).m_string_format = local_e0.m_string_format;
  (this->m_right_length).m_context_locale_id = local_e0.m_context_locale_id;
  (this->m_right_length).m_length_unit_system.m_unit_system =
       local_e0.m_length_unit_system.m_unit_system;
  *(undefined3 *)&(this->m_right_length).m_length_unit_system.field_0x1 =
       local_e0.m_length_unit_system._1_3_;
  (this->m_right_length).m_length_unit_system.m_reserved = local_e0.m_length_unit_system.m_reserved;
  (this->m_right_length).m_length_unit_system.m_meters_per_custom_unit =
       local_e0.m_length_unit_system.m_meters_per_custom_unit;
  ON_wString::operator=(src,src_01);
  (this->m_right_length).m_length = local_e0.m_length;
  ON_wString::operator=(src_00,&local_e0.m_length_as_string);
  Create(&local_b0,&this->m_left_length,&this->m_right_length,None);
  ON_wString::IsValid(&local_b0.m_scale_as_string,true);
  ON_wString::operator=(&this->m_scale_as_string,&local_b0.m_scale_as_string);
  ~ON_ScaleValue(&local_b0);
  ON_wString::~ON_wString(&local_e0.m_length_as_string);
  ON_wString::~ON_wString(src_01);
  return;
}

Assistant:

void ON_ScaleValue::SwapLeftAndRight()
{
  double x = m_left_to_right_scale;
  m_left_to_right_scale = m_right_to_left_scale;
  m_right_to_left_scale = x;

  ON_LengthValue t = m_left_length;
  m_left_length = m_right_length;
  m_right_length = t;

  // TODO: properly reverse string
  m_scale_as_string = ON_ScaleValue::Create(m_left_length,m_right_length,ON_ScaleValue::ScaleStringFormat::None).ScaleAsString();
}